

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbvthandler.cpp
# Opt level: O0

void __thiscall QFbVtHandler::handleSignal(QFbVtHandler *this)

{
  __pid_t __pid;
  qint64 qVar1;
  ulong uVar2;
  QFbVtHandler *in_RDI;
  long in_FS_OFFSET;
  char sigNo;
  QFbVtHandler *data;
  undefined4 in_stack_fffffffffffffff4;
  int fd;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  data = in_RDI;
  QSocketNotifier::setEnabled(SUB81(in_RDI->m_signalNotifier,0));
  fd = CONCAT13(0xaa,(int3)in_stack_fffffffffffffff4);
  qVar1 = qt_safe_read(fd,data,(qint64)in_RDI);
  if (qVar1 == 1) {
    uVar2 = (ulong)((int)(char)((uint)fd >> 0x18) - 2);
    switch(uVar2) {
    case 0:
    case 0xd:
      handleInt(in_RDI);
      break;
    default:
      break;
    case 0x10:
      setTTYCursor(SUB81((ulong)lVar3 >> 0x38,0));
      setKeyboardEnabled(in_RDI,SUB81(uVar2 >> 0x38,0));
      resumed((QFbVtHandler *)0x1353cd);
      break;
    case 0x12:
      aboutToSuspend((QFbVtHandler *)0x135384);
      setKeyboardEnabled(in_RDI,SUB81(uVar2 >> 0x38,0));
      setTTYCursor(SUB81((ulong)lVar3 >> 0x38,0));
      __pid = getpid();
      kill(__pid,0x13);
    }
  }
  QSocketNotifier::setEnabled(SUB81(in_RDI->m_signalNotifier,0));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbVtHandler::handleSignal()
{
#ifdef VTH_ENABLED
    m_signalNotifier->setEnabled(false);

    char sigNo;
    if (QT_READ(m_sigFd[1], &sigNo, sizeof(sigNo)) == sizeof(sigNo)) {
        switch (sigNo) {
        case SIGINT:
        case SIGTERM:
            handleInt();
            break;
        case SIGTSTP:
            emit aboutToSuspend();
            setKeyboardEnabled(true);
            setTTYCursor(true);
            ::kill(getpid(), SIGSTOP);
            break;
        case SIGCONT:
            setTTYCursor(false);
            setKeyboardEnabled(false);
            emit resumed();
            break;
        default:
            break;
        }
    }

    m_signalNotifier->setEnabled(true);
#endif
}